

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::ParseHelper_Decode_Base64
          (AMFImporter *this,string *pInputBase64,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pOutputData)

{
  byte bVar1;
  pointer puVar2;
  uint8_t uVar3;
  int iVar4;
  ulong uVar5;
  DeadlyImportError *this_00;
  uint uVar6;
  size_type sVar7;
  uint8_t i;
  long lVar8;
  ulong uVar9;
  uint8_t i_1;
  bool bVar10;
  uint8_t arr4 [4];
  uint8_t arr3 [3];
  allocator local_81;
  string *local_80;
  long local_78;
  string base64_chars;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&base64_chars,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             (allocator *)&local_50);
  uVar5 = pInputBase64->_M_string_length;
  local_80 = pInputBase64;
  if ((uVar5 & 3) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_50,"Base64-encoded data must have size multiply of four.",&local_81)
    ;
    DeadlyImportError::DeadlyImportError(this_00,&local_50);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    uVar5 = pInputBase64->_M_string_length;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(pOutputData,(uVar5 >> 2) * 3);
  sVar7 = local_80->_M_string_length;
  uVar5 = 0;
  lVar8 = 0;
  while( true ) {
    uVar9 = uVar5 & 0xff;
    bVar10 = sVar7 == 0;
    sVar7 = sVar7 - 1;
    if (bVar10) break;
    bVar1 = (local_80->_M_dataplus)._M_p[lVar8];
    if ((char)bVar1 == 0x3d) break;
    local_78 = lVar8;
    iVar4 = isalnum((int)(char)bVar1);
    if (((bVar1 & 0xfb) == 0x2b) || (iVar4 != 0)) {
      uVar6 = (int)uVar9 + 1;
      uVar5 = (ulong)uVar6;
      arr4[uVar9] = bVar1;
      if ((char)uVar6 == '\x04') {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          uVar3 = std::__cxx11::string::find
                            ((char)&base64_chars,(ulong)(uint)(int)(char)arr4[lVar8]);
          arr4[lVar8] = uVar3;
        }
        arr3[0] = arr4[1] >> 4 & 3 | arr4[0] << 2;
        arr3[1] = arr4[2] >> 2 & 0xf | arr4[1] << 4;
        arr3[2] = arr4[2] * '@' + arr4[3];
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (pOutputData,arr3 + lVar8);
        }
        uVar5 = 0;
      }
    }
    lVar8 = local_78 + 1;
  }
  if ((char)uVar5 != '\0') {
    for (; uVar9 < 4; uVar9 = uVar9 + 1) {
      arr4[uVar9] = '\0';
    }
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      uVar3 = std::__cxx11::string::find((char)&base64_chars,(ulong)(uint)(int)(char)arr4[lVar8]);
      arr4[lVar8] = uVar3;
    }
    arr3[0] = arr4[1] >> 4 & 3 | arr4[0] << 2;
    arr3[1] = arr4[2] >> 2 & 0xf | arr4[1] << 4;
    arr3[2] = arr4[2] * '@' + arr4[3];
    for (lVar8 = 0; (byte)lVar8 < (byte)((char)uVar5 - 1U); lVar8 = lVar8 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (pOutputData,arr3 + lVar8);
    }
  }
  std::__cxx11::string::~string((string *)&base64_chars);
  return;
}

Assistant:

void AMFImporter::ParseHelper_Decode_Base64(const std::string& pInputBase64, std::vector<uint8_t>& pOutputData) const
{
    // With help from
    // René Nyffenegger http://www.adp-gmbh.ch/cpp/common/base64.html
    const std::string base64_chars = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    uint8_t tidx = 0;
    uint8_t arr4[4], arr3[3];

	// check input data
	if(pInputBase64.size() % 4) throw DeadlyImportError("Base64-encoded data must have size multiply of four.");
	// prepare output place
	pOutputData.clear();
	pOutputData.reserve(pInputBase64.size() / 4 * 3);

	for(size_t in_len = pInputBase64.size(), in_idx = 0; (in_len > 0) && (pInputBase64[in_idx] != '='); in_len--)
	{
		if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		{
			arr4[tidx++] = pInputBase64[in_idx++];
			if(tidx == 4)
			{
				for(tidx = 0; tidx < 4; tidx++) arr4[tidx] = (uint8_t)base64_chars.find(arr4[tidx]);

				arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
				arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
				arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
				for(tidx = 0; tidx < 3; tidx++) pOutputData.push_back(arr3[tidx]);

				tidx = 0;
			}// if(tidx == 4)
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		else
		{
			in_idx++;
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx])) else
	}

	if(tidx)
	{
		for(uint8_t i = tidx; i < 4; i++) arr4[i] = 0;
		for(uint8_t i = 0; i < 4; i++) arr4[i] = (uint8_t)(base64_chars.find(arr4[i]));

		arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
		arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
		arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
		for(uint8_t i = 0; i < (tidx - 1); i++) pOutputData.push_back(arr3[i]);
	}
}